

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-while-connecting.c
# Opt level: O0

int run_test_tcp_close_while_connecting(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_loop_t *loop;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_ip4_addr("1.2.3.4",0x23a3,&loop);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
            ,0x48,"uv_ip4_addr(\"1.2.3.4\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(loop_00,&tcp_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
            ,0x49,"uv_tcp_init(loop, &tcp_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_tcp_connect(addr.sin_zero,&tcp_handle,&loop,connect_cb);
  if (iVar1 == -0x65) {
    fprintf(_stderr,"%s\n","Network unreachable.");
    fflush(_stderr);
    connect_req.queue.prev._4_4_ = 7;
  }
  else {
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x50,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_timer_init(loop_00,&timer1_handle);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x51,"uv_timer_init(loop, &timer1_handle)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_timer_start(&timer1_handle,timer1_cb,1,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x52,"uv_timer_start(&timer1_handle, timer1_cb, 1, 0)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_timer_init(loop_00,&timer2_handle);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x53,"uv_timer_init(loop, &timer2_handle)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_timer_start(&timer2_handle,timer2_cb,86400000,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x54,"uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0)","==","0",
              (long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_run(loop_00,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x55,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
      abort();
    }
    if ((long)connect_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x57,"1","==","connect_cb_called",1,"==",(long)connect_cb_called);
      abort();
    }
    if ((long)timer1_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x58,"1","==","timer1_cb_called",1,"==",(long)timer1_cb_called);
      abort();
    }
    if ((long)close_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x59,"2","==","close_cb_called",2,"==",(long)close_cb_called);
      abort();
    }
    close_loop(loop_00);
    iVar1 = uv_loop_close(loop_00);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-while-connecting.c"
              ,0x5b,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
      abort();
    }
    uv_library_shutdown();
    if (netunreach_errors < 1) {
      connect_req.queue.prev._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"%s\n","Network unreachable.");
      fflush(_stderr);
      connect_req.queue.prev._4_4_ = 7;
    }
  }
  return connect_req.queue.prev._4_4_;
}

Assistant:

TEST_IMPL(tcp_close_while_connecting) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("1.2.3.4", TEST_PORT, &addr));
  ASSERT_OK(uv_tcp_init(loop, &tcp_handle));
  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  if (r == UV_ENETUNREACH)
    RETURN_SKIP("Network unreachable.");
  ASSERT_OK(r);
  ASSERT_OK(uv_timer_init(loop, &timer1_handle));
  ASSERT_OK(uv_timer_start(&timer1_handle, timer1_cb, 1, 0));
  ASSERT_OK(uv_timer_init(loop, &timer2_handle));
  ASSERT_OK(uv_timer_start(&timer2_handle, timer2_cb, 86400 * 1000, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, timer1_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);

  if (netunreach_errors > 0)
    RETURN_SKIP("Network unreachable.");

  return 0;
}